

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O1

Type * __thiscall
slang::ast::builtins::AssertControlTask::checkArguments
          (AssertControlTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  Expression *pEVar2;
  Symbol *this_00;
  bool bVar3;
  bool bVar4;
  Scope *pSVar5;
  long lVar6;
  ulong uVar7;
  Type *local_38;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar3 = SystemSubroutine::checkArgCount
                    ((SystemSubroutine *)this,context,false,args,range,(ulong)this->isFullMethod,
                     0x7fffffff);
  lVar6 = 400;
  if (bVar3) {
    bVar3 = (args->_M_extent)._M_extent_value != 0;
    if (bVar3) {
      uVar7 = 0;
      do {
        bVar4 = uVar7 != 0;
        if (this->isFullMethod != false) {
          bVar4 = 3 < uVar7;
        }
        pEVar2 = args->_M_ptr[uVar7];
        if (bVar4) {
          if (pEVar2->kind == ArbitrarySymbol) {
            this_00 = *(Symbol **)(pEVar2 + 1);
            pSVar5 = Symbol::scopeOrNull(this_00);
            bVar4 = true;
            if ((pSVar5 == (Scope *)0x0) && (this_00->kind != Instance)) goto LAB_004042b7;
          }
          else {
LAB_004042b7:
            bVar4 = Scope::isUninstantiated((context->scope).ptr);
            if (!bVar4) {
              ASTContext::addDiag(context,(DiagCode)0xe000b,args->_M_ptr[uVar7]->sourceRange);
            }
            local_38 = pCVar1->errorType;
            bVar4 = false;
          }
          if (!bVar4) break;
        }
        else {
          bVar4 = Type::isIntegral((pEVar2->type).ptr);
          if (!bVar4) {
            local_38 = SystemSubroutine::badArg
                                 ((SystemSubroutine *)this,context,args->_M_ptr[uVar7]);
            break;
          }
        }
        uVar7 = uVar7 + 1;
        bVar3 = uVar7 < (args->_M_extent)._M_extent_value;
      } while (bVar3);
    }
    lVar6 = 0x188;
    if (bVar3) {
      return local_38;
    }
  }
  return *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar6);
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, isFullMethod ? 1 : 0, INT32_MAX))
            return comp.getErrorType();

        for (size_t i = 0; i < args.size(); i++) {
            // If this is $assertcontrol, the first four args are integer expressions.
            // Otherwise, only the first arg is an integer expression. The rest, in both
            // cases, are hierarchical references.
            if ((isFullMethod && i < 4) || (!isFullMethod && i == 0)) {
                if (!args[i]->type->isIntegral())
                    return badArg(context, *args[i]);
            }
            else {
                auto isScope = [](const Symbol& symbol) {
                    return symbol.isScope() || symbol.kind == SymbolKind::Instance;
                };

                if (args[i]->kind != ExpressionKind::ArbitrarySymbol ||
                    !isScope(*args[i]->as<ArbitrarySymbolExpression>().symbol)) {
                    if (!context.scope->isUninstantiated())
                        context.addDiag(diag::ExpectedScopeOrAssert, args[i]->sourceRange);
                    return comp.getErrorType();
                }
            }
        }

        return comp.getVoidType();
    }